

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void Imf_2_5::anon_unknown_7::readLineOffsets
               (IStream *is,LineOrder lineOrder,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets,bool *complete)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer puVar4;
  ulong uVar5;
  pointer puVar6;
  ulong uVar7;
  int local_40 [2];
  undefined8 local_38;
  
  uVar1 = 0;
  while( true ) {
    puVar4 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
    if (uVar5 <= uVar1) break;
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,puVar4 + uVar1);
    uVar1 = uVar1 + 1;
  }
  *complete = true;
  uVar7 = 0;
  do {
    if (uVar5 <= uVar7) {
      return;
    }
    puVar6 = puVar4 + uVar7;
    uVar7 = (ulong)((int)uVar7 + 1);
  } while (*puVar6 != 0);
  *complete = false;
  iVar2 = (*is->_vptr_IStream[5])(is);
  local_38 = CONCAT44(extraout_var,iVar2);
  puVar4 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar1 = 0; uVar5 = (ulong)uVar1,
      uVar5 < (ulong)((long)(lineOffsets->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3);
      uVar1 = uVar1 + 1) {
    iVar3 = (*is->_vptr_IStream[5])(is);
    (*is->_vptr_IStream[3])(is,local_40,4);
    (*is->_vptr_IStream[3])(is,local_40,8);
    iVar2 = local_40[0];
    (*is->_vptr_IStream[3])(is,local_40,8);
    Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,local_40[0] + iVar2 + 8);
    if (lineOrder == INCREASING_Y) {
      puVar4 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar6 = puVar4 + uVar5;
    }
    else {
      puVar4 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar6 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish + ~uVar5;
    }
    *puVar6 = CONCAT44(extraout_var_00,iVar3);
  }
  (*is->_vptr_IStream[7])(is);
  (*is->_vptr_IStream[6])(is,local_38);
  return;
}

Assistant:

void
readLineOffsets (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is,
                 LineOrder lineOrder,
                 vector<Int64> &lineOffsets,
                 bool &complete)
{
    for (unsigned int i = 0; i < lineOffsets.size(); i++)
    {
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, lineOffsets[i]);
    }

    complete = true;

    for (unsigned int i = 0; i < lineOffsets.size(); i++)
    {
        if (lineOffsets[i] <= 0)
        {
            //
            // Invalid data in the line offset table mean that
            // the file is probably incomplete (the table is
            // the last thing written to the file).  Either
            // some process is still busy writing the file,
            // or writing the file was aborted.
            //
            // We should still be able to read the existing
            // parts of the file.  In order to do this, we
            // have to make a sequential scan over the scan
            // line data to reconstruct the line offset table.
            //

            complete = false;
            reconstructLineOffsets (is, lineOrder, lineOffsets);
            break;
        }
    }
}